

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O3

void editions_unittest::LengthPrefixed::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(int *)&to_msg[1]._internal_metadata_.ptr_ = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&to_msg[1]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void LengthPrefixed::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<LengthPrefixed*>(&to_msg);
  auto& from = static_cast<const LengthPrefixed&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:editions_unittest.LengthPrefixed)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.a_ = from._impl_.a_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.b_ = from._impl_.b_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}